

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

ON_wString ON_RemoveIdSuffixFromString(wchar_t *source,wchar_t *separator,ON_UUID id)

{
  ON_Locale *locale;
  uchar auVar1 [8];
  ON_UUID id_00;
  ON_wString local_58 [3];
  ON_wString local_40;
  ON_wString suffix;
  ON_wString s;
  wchar_t *separator_local;
  wchar_t *source_local;
  ON_UUID id_local;
  
  auVar1 = id.Data4;
  ON_wString::ON_wString(&suffix,separator);
  ON_wString::ON_wString(&local_40,id._0_8_);
  id_00.Data4[0] = auVar1[0];
  id_00.Data4[1] = auVar1[1];
  id_00.Data4[2] = auVar1[2];
  id_00.Data4[3] = auVar1[3];
  id_00.Data4[4] = auVar1[4];
  id_00.Data4[5] = auVar1[5];
  id_00.Data4[6] = auVar1[6];
  id_00.Data4[7] = auVar1[7];
  id_00._0_8_ = local_58;
  ON_IdToString(id_00);
  ON_wString::operator+=(&local_40,local_58);
  ON_wString::~ON_wString(local_58);
  locale = (ON_Locale *)ON_wString::operator_cast_to_wchar_t_(&local_40);
  ON_wString::RemoveSuffix((ON_wString *)source,(wchar_t *)&suffix,locale,true);
  ON_wString::~ON_wString(&local_40);
  ON_wString::~ON_wString(&suffix);
  return (ON_wString)source;
}

Assistant:

ON_DECL
const ON_wString ON_RemoveIdSuffixFromString(
  const wchar_t* source,
  const wchar_t* separator,
  const ON_UUID id
)
{
  ON_wString s(source);
  ON_wString suffix(separator);
  suffix += ON_IdToString(id);
  return s.RemoveSuffix(suffix,ON_Locale::Ordinal,true);
}